

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
* Catch::
  createShard<std::set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>>
            (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
             *container,size_t shardCount,size_t shardIndex)

{
  long lVar1;
  unsigned_long *puVar2;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> __last;
  iterator __first;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> this;
  unsigned_long in_RCX;
  ulong in_RDX;
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *in_RDI;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> endIterator;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> startIterator;
  size_t endIndex;
  size_t startIndex;
  size_t leftoverTests;
  size_t shardSize;
  size_t totalTestCount;
  _Rb_tree_const_iterator<const_Catch::TestCaseHandle_*> in_stack_ffffffffffffff58;
  set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
  *in_stack_ffffffffffffff60;
  unsigned_long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  ulong local_30;
  size_type local_28;
  unsigned_long local_20;
  ulong local_18;
  
  if (in_RDX == 1) {
    std::
    set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ::set(in_stack_ffffffffffffff60,
          (set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
           *)in_stack_ffffffffffffff58._M_node);
  }
  else {
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_28 = std::
               set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
               ::size((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                       *)0x1e3ef3);
    local_30 = local_28 / local_18;
    local_38 = local_28 % local_18;
    lVar1 = local_20 * local_30;
    puVar2 = std::min<unsigned_long>(&local_20,&local_38);
    local_40 = lVar1 + *puVar2;
    lVar1 = (local_20 + 1) * local_30;
    local_50 = local_20 + 1;
    puVar2 = std::min<unsigned_long>(&local_50,&local_38);
    local_48 = lVar1 + *puVar2;
    std::
    set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
    ::begin((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
             *)in_stack_ffffffffffffff58._M_node);
    __last = std::next<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                       (in_stack_ffffffffffffff58,0x1e3fca);
    __first = std::
              set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
              ::begin(in_stack_ffffffffffffff58._M_node);
    this = std::next<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
                     (in_stack_ffffffffffffff58,0x1e3ff0);
    std::
    set<Catch::TestCaseHandle_const*,std::less<Catch::TestCaseHandle_const*>,std::allocator<Catch::TestCaseHandle_const*>>
    ::set<std::_Rb_tree_const_iterator<Catch::TestCaseHandle_const*>>
              ((set<const_Catch::TestCaseHandle_*,_std::less<const_Catch::TestCaseHandle_*>,_std::allocator<const_Catch::TestCaseHandle_*>_>
                *)this._M_node,
               (_Rb_tree_const_iterator<const_Catch::TestCaseHandle_*>)__first._M_node,__last);
  }
  return in_RDI;
}

Assistant:

Container createShard(Container const& container, std::size_t const shardCount, std::size_t const shardIndex) {
        assert(shardCount > shardIndex);

        if (shardCount == 1) {
            return container;
        }

        const std::size_t totalTestCount = container.size();

        const std::size_t shardSize = totalTestCount / shardCount;
        const std::size_t leftoverTests = totalTestCount % shardCount;

        const std::size_t startIndex = shardIndex * shardSize + (std::min)(shardIndex, leftoverTests);
        const std::size_t endIndex = (shardIndex + 1) * shardSize + (std::min)(shardIndex + 1, leftoverTests);

        auto startIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(startIndex));
        auto endIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(endIndex));

        return Container(startIterator, endIterator);
    }